

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sap_Emu.cpp
# Opt level: O0

void __thiscall Sap_Emu::cpu_jsr(Sap_Emu *this,sap_addr_t addr)

{
  byte bVar1;
  int high_byte;
  sap_addr_t addr_local;
  Sap_Emu *this_local;
  
  (this->super_Sap_Cpu).r.pc = (uint16_t)addr;
  if (((this->super_Sap_Cpu).r.sp == 0xfe) && ((this->mem).ram[0x1ff] == 0xfe)) {
    (this->super_Sap_Cpu).r.sp = 0xff;
  }
  bVar1 = (this->super_Sap_Cpu).r.sp;
  (this->super_Sap_Cpu).r.sp = bVar1 - 1;
  (this->mem).ram[(int)(bVar1 + 0x100)] = 0xfe;
  bVar1 = (this->super_Sap_Cpu).r.sp;
  (this->super_Sap_Cpu).r.sp = bVar1 - 1;
  (this->mem).ram[(int)(bVar1 + 0x100)] = 0xfe;
  bVar1 = (this->super_Sap_Cpu).r.sp;
  (this->super_Sap_Cpu).r.sp = bVar1 - 1;
  (this->mem).ram[(int)(bVar1 + 0x100)] = 0xfe;
  return;
}

Assistant:

void Sap_Emu::cpu_jsr( sap_addr_t addr )
{
	check( r.sp >= 0xFE ); // catch anything trying to leave data on stack
	r.pc = addr;
	int high_byte = (idle_addr - 1) >> 8;
	if ( r.sp == 0xFE && mem.ram [0x1FF] == high_byte )
		r.sp = 0xFF; // pop extra byte off
	mem.ram [0x100 + r.sp--] = high_byte; // some routines use RTI to return
	mem.ram [0x100 + r.sp--] = high_byte;
	mem.ram [0x100 + r.sp--] = (idle_addr - 1) & 0xFF;
}